

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O1

int Abc_NtkRetimeFinalizeLatches(Abc_Ntk_t *pNtk,st__table *tLatches,int nIdMaxStart)

{
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  Vec_Ptr_t *__ptr_01;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pObj;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  Abc_Ntk_t *pNtk_00;
  long lVar13;
  int Index;
  Abc_Obj_t *local_58;
  int local_4c;
  Abc_Ntk_t *local_48;
  Vec_Ptr_t *local_40;
  Abc_Obj_t *local_38;
  
  __ptr = pNtk->vCis;
  pNtk->vCis = (Vec_Ptr_t *)0x0;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  __ptr_00 = pNtk->vCos;
  pNtk->vCos = (Vec_Ptr_t *)0x0;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar6->pArray = ppvVar5;
  __ptr_01 = pNtk->vBoxes;
  pNtk->vBoxes = (Vec_Ptr_t *)0x0;
  local_48 = pNtk;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar7->pArray = ppvVar5;
  uVar8 = (ulong)(uint)__ptr->nSize;
  if (tLatches->num_entries < __ptr->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar8 <= lVar13) goto LAB_004557f5;
      pvVar1 = __ptr->pArray[lVar13];
      uVar11 = pVVar4->nCap;
      if (pVVar4->nSize == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar11 * 2;
          if (iVar3 <= (int)uVar11) goto LAB_00455182;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar11 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar11 << 4);
          }
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = iVar3;
      }
LAB_00455182:
      iVar3 = pVVar4->nSize;
      pVVar4->nSize = iVar3 + 1;
      pVVar4->pArray[iVar3] = pvVar1;
      lVar13 = lVar13 + 1;
      uVar8 = (ulong)__ptr->nSize;
    } while (lVar13 < (long)(uVar8 - (long)tLatches->num_entries));
  }
  uVar8 = (ulong)(uint)__ptr_00->nSize;
  if (tLatches->num_entries < __ptr_00->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar8 <= lVar13) goto LAB_004557f5;
      pvVar1 = __ptr_00->pArray[lVar13];
      uVar11 = pVVar6->nCap;
      if (pVVar6->nSize == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
          }
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar11 * 2;
          if (iVar3 <= (int)uVar11) goto LAB_00455245;
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar11 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar11 << 4);
          }
        }
        pVVar6->pArray = ppvVar5;
        pVVar6->nCap = iVar3;
      }
LAB_00455245:
      iVar3 = pVVar6->nSize;
      pVVar6->nSize = iVar3 + 1;
      pVVar6->pArray[iVar3] = pvVar1;
      lVar13 = lVar13 + 1;
      uVar8 = (ulong)__ptr_00->nSize;
    } while (lVar13 < (long)(uVar8 - (long)tLatches->num_entries));
  }
  uVar8 = (ulong)(uint)__ptr_01->nSize;
  if (tLatches->num_entries < __ptr_01->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar8 <= lVar13) goto LAB_004557f5;
      pvVar1 = __ptr_01->pArray[lVar13];
      uVar11 = pVVar7->nCap;
      if (pVVar7->nSize == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar7->pArray,0x80);
          }
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar11 * 2;
          if (iVar3 <= (int)uVar11) goto LAB_0045530d;
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar11 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar7->pArray,(ulong)uVar11 << 4);
          }
        }
        pVVar7->pArray = ppvVar5;
        pVVar7->nCap = iVar3;
      }
LAB_0045530d:
      iVar3 = pVVar7->nSize;
      pVVar7->nSize = iVar3 + 1;
      pVVar7->pArray[iVar3] = pvVar1;
      lVar13 = lVar13 + 1;
      uVar8 = (ulong)__ptr_01->nSize;
    } while (lVar13 < (long)(uVar8 - (long)tLatches->num_entries));
  }
  pVVar9 = local_48->vObjs;
  pNtk_00 = local_48;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    local_40 = pVVar7;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8)) {
        if ((uint)pAVar2->Id < (uint)nIdMaxStart) {
          iVar3 = st__lookup_int(tLatches,(char *)pAVar2,&local_4c);
          if (iVar3 == 0) {
            puts("Abc_NtkRetimeFinalizeLatches(): Internal error.");
            return 0;
          }
          iVar3 = tLatches->num_entries;
          uVar11 = (__ptr_01->nSize - iVar3) + local_4c;
          if (((int)uVar11 < 0) || (__ptr_01->nSize <= (int)uVar11)) {
LAB_004557f5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (pAVar2 != (Abc_Obj_t *)__ptr_01->pArray[uVar11]) {
            __assert_fail("pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retIncrem.c"
                          ,0xb8,"int Abc_NtkRetimeFinalizeLatches(Abc_Ntk_t *, st__table *, int)");
          }
          uVar11 = (__ptr_00->nSize - iVar3) + local_4c;
          if (((int)uVar11 < 0) || (__ptr_00->nSize <= (int)uVar11)) goto LAB_004557f5;
          uVar12 = (__ptr->nSize - iVar3) + local_4c;
          if (((int)uVar12 < 0) || (__ptr->nSize <= (int)uVar12)) goto LAB_004557f5;
          pObj = (Abc_Obj_t *)__ptr_00->pArray[uVar11];
          local_58 = (Abc_Obj_t *)__ptr->pArray[uVar12];
        }
        else {
          pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BI);
          local_58 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BO);
          pcVar10 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(local_58,pcVar10,"_out");
          pcVar10 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pObj,pcVar10,"_in");
        }
        Abc_ObjAddFanin(pObj,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
        local_38 = pObj;
        Abc_ObjPatchFanin(pAVar2,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]
                          ,pObj);
        if (0 < (pAVar2->vFanouts).nSize) {
          Abc_ObjTransferFanout(pAVar2,local_58);
        }
        Abc_ObjAddFanin(local_58,pAVar2);
        pVVar7 = local_40;
        uVar11 = pVVar4->nCap;
        if (pVVar4->nSize == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar11 * 2;
            if (iVar3 <= (int)uVar11) goto LAB_00455579;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar11 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar3;
        }
LAB_00455579:
        iVar3 = pVVar4->nSize;
        pVVar4->nSize = iVar3 + 1;
        pVVar4->pArray[iVar3] = local_58;
        uVar11 = pVVar6->nCap;
        if (pVVar6->nSize == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar11 * 2;
            if (iVar3 <= (int)uVar11) goto LAB_004555fc;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar11 << 4);
            }
          }
          pVVar6->pArray = ppvVar5;
          pVVar6->nCap = iVar3;
        }
LAB_004555fc:
        iVar3 = pVVar6->nSize;
        pVVar6->nSize = iVar3 + 1;
        pVVar6->pArray[iVar3] = local_38;
        uVar11 = pVVar7->nCap;
        if (pVVar7->nSize == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar7->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar11 * 2;
            if (iVar3 <= (int)uVar11) goto LAB_0045567b;
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar7->pArray,(ulong)uVar11 << 4);
            }
          }
          pVVar7->pArray = ppvVar5;
          pVVar7->nCap = iVar3;
        }
LAB_0045567b:
        iVar3 = pVVar7->nSize;
        pVVar7->nSize = iVar3 + 1;
        pVVar7->pArray[iVar3] = pAVar2;
        pNtk_00 = local_48;
      }
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk_00->vObjs;
    } while (lVar13 < pVVar9->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar13 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)__ptr->pArray[lVar13];
      if ((((*(uint *)&pAVar2->field_0x14 & 0xf) != 2) && ((pAVar2->vFanins).nSize == 0)) &&
         ((pAVar2->vFanouts).nSize == 0)) {
        Abc_NtkDeleteObj(pAVar2);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < __ptr->nSize);
  }
  if (0 < __ptr_00->nSize) {
    lVar13 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)__ptr_00->pArray[lVar13];
      if ((((*(uint *)&pAVar2->field_0x14 & 0xf) != 3) && ((pAVar2->vFanins).nSize == 0)) &&
         ((pAVar2->vFanouts).nSize == 0)) {
        Abc_NtkDeleteObj(pAVar2);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < __ptr_00->nSize);
  }
  pNtk_00->vCis = pVVar4;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  pNtk_00->vCos = pVVar6;
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (void **)0x0;
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    free(__ptr_00);
  }
  pNtk_00->vBoxes = pVVar7;
  if (__ptr_01->pArray != (void **)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (void **)0x0;
  }
  if (__ptr_01 != (Vec_Ptr_t *)0x0) {
    free(__ptr_01);
  }
  return 1;
}

Assistant:

int Abc_NtkRetimeFinalizeLatches( Abc_Ntk_t * pNtk, st__table * tLatches, int nIdMaxStart )
{
    Vec_Ptr_t * vCisOld, * vCosOld, * vBoxesOld, * vCisNew, * vCosNew, * vBoxesNew;
    Abc_Obj_t * pObj, * pLatch, * pLatchIn, * pLatchOut;
    int i, Index;
    // create new arrays
    vCisOld   = pNtk->vCis;    pNtk->vCis   = NULL;  vCisNew   = Vec_PtrAlloc( 100 );
    vCosOld   = pNtk->vCos;    pNtk->vCos   = NULL;  vCosNew   = Vec_PtrAlloc( 100 );  
    vBoxesOld = pNtk->vBoxes;  pNtk->vBoxes = NULL;  vBoxesNew = Vec_PtrAlloc( 100 );
    // copy boxes and their CIs/COs
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCisOld, pObj, i, Vec_PtrSize(vCisOld) - st__count(tLatches) )
        Vec_PtrPush( vCisNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCosOld, pObj, i, Vec_PtrSize(vCosOld) - st__count(tLatches) )
        Vec_PtrPush( vCosNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vBoxesOld, pObj, i, Vec_PtrSize(vBoxesOld) - st__count(tLatches) )
        Vec_PtrPush( vBoxesNew, pObj );
    // go through the latches
    Abc_NtkForEachObj( pNtk, pLatch, i )
    {
        if ( !Abc_ObjIsLatch(pLatch) )
            continue;
        if ( Abc_ObjId(pLatch) >= (unsigned)nIdMaxStart )
        {
            // this is a new latch 
            pLatchIn  = Abc_NtkCreateBi(pNtk);
            pLatchOut = Abc_NtkCreateBo(pNtk);
            Abc_ObjAssignName( pLatchOut, Abc_ObjName(pLatch), "_out" );
            Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pLatch), "_in" );
        }
        else
        {
            // this is an old latch 
            // get its number in the original order
            if ( ! st__lookup_int( tLatches, (char *)pLatch, &Index ) )
            {
                printf( "Abc_NtkRetimeFinalizeLatches(): Internal error.\n" );
                return 0;
            }
            assert( pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index) );
            // reconnect with the old LIs/LOs
            pLatchIn  = (Abc_Obj_t *)Vec_PtrEntry( vCosOld, Vec_PtrSize(vCosOld) - st__count(tLatches) + Index );
            pLatchOut = (Abc_Obj_t *)Vec_PtrEntry( vCisOld, Vec_PtrSize(vCisOld) - st__count(tLatches) + Index );
        }
        // connect
        Abc_ObjAddFanin( pLatchIn, Abc_ObjFanin0(pLatch) );
        Abc_ObjPatchFanin( pLatch, Abc_ObjFanin0(pLatch), pLatchIn );
        if ( Abc_ObjFanoutNum(pLatch) > 0 )
            Abc_ObjTransferFanout( pLatch, pLatchOut );
        Abc_ObjAddFanin( pLatchOut, pLatch );
        // add to the arrays
        Vec_PtrPush( vCisNew, pLatchOut );
        Vec_PtrPush( vCosNew, pLatchIn );
        Vec_PtrPush( vBoxesNew, pLatch );
    }
    // free useless Cis/Cos
    Vec_PtrForEachEntry( Abc_Obj_t *, vCisOld, pObj, i )
        if ( !Abc_ObjIsPi(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    Vec_PtrForEachEntry( Abc_Obj_t *, vCosOld, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    // set the new arrays
    pNtk->vCis   = vCisNew;   Vec_PtrFree( vCisOld );
    pNtk->vCos   = vCosNew;   Vec_PtrFree( vCosOld );
    pNtk->vBoxes = vBoxesNew; Vec_PtrFree( vBoxesOld );
    return 1;
}